

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O0

void __thiscall Node::ScanMap(Node *this)

{
  int iVar1;
  bool local_14d;
  __cxx11 local_138 [32];
  string local_118 [32];
  string local_f8 [8];
  string tempname;
  string local_c8 [32];
  undefined1 local_a8 [8];
  VariableStruct ThisVar;
  Node *this_local;
  
  ThisVar.ParList.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::__cxx11::string::string(local_c8,(string *)&this->Tree[0]->TextValue);
  VariableStruct::VariableStruct
            ((VariableStruct *)local_a8,(string *)local_c8,VARTYPE_STRUCT,VARCLASS_NONE,1,0);
  std::__cxx11::string::~string(local_c8);
  genname(local_f8);
  iVar1 = VariableList::LookupReserved(Variables,local_f8);
  if (iVar1 != 0) {
    iVar1 = Variables->vcount;
    Variables->vcount = iVar1 + 1;
    std::__cxx11::to_string(local_138,iVar1);
    std::operator+((char *)local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_V");
    std::__cxx11::string::operator+=((string *)local_f8,local_118);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string((string *)local_138);
  }
  std::__cxx11::string::operator=((string *)&ThisVar.Type,(string *)local_f8);
  VariableList::Append(Variables,(VariableStruct *)local_a8,0);
  VariableList::Fixup(Variables);
  if (this->Tree[1] != (Node *)0x0) {
    local_14d = false;
    if (this->Tree[1]->Type == 0x1d8) {
      local_14d = this->Tree[1]->Block[0] == (Node *)0x0;
    }
    ScanOneMap(this->Tree[1],(VariableStruct *)local_a8,(uint)local_14d);
  }
  std::__cxx11::string::~string((string *)local_f8);
  VariableStruct::~VariableStruct((VariableStruct *)local_a8);
  return;
}

Assistant:

void Node::ScanMap(void)
{
	VariableStruct ThisVar(Tree[0]->TextValue,
		VARTYPE_STRUCT, VARCLASS_NONE, true);

	//
	// We need to name the map so we can use the nasme as a prefix.
	// This will likely cause problems with ocerlapping MAP/COMMON
	// statements, but it's better than nothing.
	//
	std::string tempname = genname(ThisVar.BasicName);
	if (Variables->LookupReserved(tempname) == false)
	{
		//tempName = tempname;
	}
	else
	{
		tempname += "_V" + std::to_string(Variables->vcount++);
	}
	ThisVar.CName = tempname;

	Variables->Append(ThisVar);
	Variables->Fixup();
 
	if (Tree[1] != 0)
	{
		Tree[1]->ScanOneMap(&ThisVar,
			Tree[1]->Type == BAS_V_DEFINEVAR &&
			Tree[1]->Block[0] == 0);
	}
}